

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O1

void __thiscall ON_DimStyle::SetFieldOverrideAll(ON_DimStyle *this,bool bOverrideParent)

{
  ON__UINT32 OVar1;
  undefined8 uVar2;
  field field_id_00;
  uint field_id;
  uint field_as_unsigned;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,bOverrideParent) == 0) {
    OVar1 = this->m_field_override_parent_count;
    this->m_field_override_parent_count = 0;
    this->m_field_override_parent_bits0 = 0;
    this->m_field_override_parent_bits1 = 0;
    this->m_field_override_parent_bits2 = 0;
    this->m_field_override_parent_bits3 = 0;
    if (OVar1 != 0) {
      ON_ModelComponent::IncrementContentVersionNumber(&this->super_ON_ModelComponent);
      *(undefined4 *)((this->m_content_hash).m_digest + 0x10) =
           ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
      uVar2 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
      *(undefined8 *)(this->m_content_hash).m_digest = ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_
      ;
      *(undefined8 *)((this->m_content_hash).m_digest + 8) = uVar2;
    }
  }
  else {
    field_as_unsigned = 3;
    do {
      field_id_00 = FieldFromUnsigned(field_as_unsigned);
      SetFieldOverride(this,field_id_00,true);
      field_as_unsigned = field_as_unsigned + 1;
    } while (field_as_unsigned != 0x73);
  }
  return;
}

Assistant:

void ON_DimStyle::SetFieldOverrideAll(bool bOverrideParent)
{
  if (false == bOverrideParent)
  {
    const bool bContentChange = (0 != m_field_override_parent_count);
    m_field_override_parent_count = 0;
    m_field_override_parent_bits0 = 0;
    m_field_override_parent_bits1 = 0;
    m_field_override_parent_bits2 = 0;
    m_field_override_parent_bits3 = 0;
    if (bContentChange)
      Internal_ContentChange();
  }
  else
  {
    const unsigned int field_id_count = static_cast<unsigned int>(ON_DimStyle::field::Count);
    for (
      unsigned int field_id = static_cast<unsigned int>(ON_DimStyle::field::Index) + 1;
      field_id < field_id_count;
      field_id++)
    {
      SetFieldOverride(ON_DimStyle::FieldFromUnsigned(field_id), true);
    }
  }
}